

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O2

bool amrex::VisMF::Check(string *mf_name)

{
  char cVar1;
  char cVar2;
  pointer pFVar3;
  ostream *poVar4;
  Print *pPVar5;
  bool bVar6;
  ostringstream *poVar7;
  long lVar8;
  long lVar9;
  char c;
  int local_55c;
  string *local_558;
  long local_550;
  string FullHdrFileName;
  string FullName;
  ifstream ifs;
  ostream local_4f8 [16];
  int aiStack_4e8 [122];
  Header hdr;
  Print local_1d8;
  Box local_4c;
  
  if (*(int *)(ParallelContext::frames + 0xc) != 0) {
    return true;
  }
  local_558 = mf_name;
  if (verbose != 0) {
    poVar4 = OutStream();
    Print::Print((Print *)&ifs,poVar4);
    std::operator<<(local_4f8,"---------------- VisMF::Check:  about to check:  ");
    std::operator<<(local_4f8,(string *)local_558);
    std::endl<char,std::char_traits<char>>(local_4f8);
    Print::~Print((Print *)&ifs);
  }
  Header::Header(&hdr);
  std::__cxx11::string::string((string *)&FullHdrFileName,(string *)local_558);
  std::__cxx11::string::append((char *)&FullHdrFileName);
  std::ifstream::ifstream(&ifs,FullHdrFileName._M_dataplus._M_p,_S_in);
  amrex::operator>>((istream *)&ifs,&hdr);
  std::ifstream::close();
  std::ifstream::~ifstream(&ifs);
  if (verbose != 0) {
    poVar4 = OutStream();
    Print::Print((Print *)&ifs,poVar4);
    std::operator<<(local_4f8,"hdr.version =  ");
    std::ostream::operator<<(local_4f8,hdr.m_vers);
    std::operator<<(local_4f8,"\n");
    std::operator<<(local_4f8,"hdr.boxarray size =  ");
    std::ostream::_M_insert<long>((long)local_4f8);
    std::operator<<(local_4f8,"\n");
    std::operator<<(local_4f8,"mf.ncomp =  ");
    std::ostream::operator<<(local_4f8,hdr.m_ncomp);
    std::operator<<(local_4f8,"\n");
    std::operator<<(local_4f8,"number of fabs on disk =  ");
    std::ostream::_M_insert<long>((long)local_4f8);
    std::operator<<(local_4f8,"\n");
    std::operator<<(local_4f8,"DirName = ");
    DirName((string *)&local_1d8,local_558);
    std::operator<<(local_4f8,(string *)&local_1d8);
    std::operator<<(local_4f8,"\n");
    std::operator<<(local_4f8,"mf_name = ");
    std::operator<<(local_4f8,(string *)local_558);
    std::operator<<(local_4f8,"\n");
    std::operator<<(local_4f8,"FullHdrFileName = ");
    std::operator<<(local_4f8,(string *)&FullHdrFileName);
    std::operator<<(local_4f8,"\n");
    std::__cxx11::string::~string((string *)&local_1d8);
    Print::~Print((Print *)&ifs);
  }
  if (hdr.m_vers == 1) {
    lVar9 = 0x20;
    local_55c = 0;
    lVar8 = 0;
    while (pFVar3 = hdr.m_fod.
                    super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>.
                    super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          lVar8 < ((long)hdr.m_fod.
                         super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                         .
                         super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)hdr.m_fod.
                        super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                        .
                        super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x28) {
      DirName(&FullName,local_558);
      local_550 = lVar8;
      std::__cxx11::string::append((string *)&FullName);
      std::ifstream::ifstream(&ifs);
      std::ifstream::open((char *)&ifs,(_Ios_Openmode)FullName._M_dataplus._M_p);
      if (*(int *)((long)aiStack_4e8 + *(long *)(_ifs + -0x18)) == 0) {
        std::istream::seekg((long)&ifs,
                            (_Ios_Seekdir)
                            *(undefined8 *)((long)&(pFVar3->m_name)._M_dataplus._M_p + lVar9));
        std::operator>>((istream *)&ifs,&c);
        cVar1 = c;
        std::operator>>((istream *)&ifs,&c);
        cVar2 = c;
        std::operator>>((istream *)&ifs,&c);
        if ((((c != 'B') || (cVar2 != 'A')) || (cVar1 != 'F')) &&
           (local_55c = local_55c + 1, verbose != 0)) {
          poVar4 = OutStream();
          AllPrint::AllPrint((AllPrint *)&local_1d8,poVar4);
          std::operator<<((ostream *)&local_1d8.ss,"**** Error in file:  ");
          lVar8 = local_550;
          std::operator<<((ostream *)&local_1d8.ss,(string *)&FullName);
          std::operator<<((ostream *)&local_1d8.ss,"  Bad Fab at index = ");
          std::ostream::operator<<(&local_1d8.ss,(int)lVar8);
          std::operator<<((ostream *)&local_1d8.ss,"  seekpos = ");
          pPVar5 = Print::operator<<(&local_1d8,
                                     (long *)((long)&(pFVar3->m_name)._M_dataplus._M_p + lVar9));
          poVar7 = &pPVar5->ss;
          std::operator<<((ostream *)poVar7,"  box = ");
          BoxArray::operator[](&local_4c,&hdr.m_ba,(int)lVar8);
          amrex::operator<<((ostream *)poVar7,&local_4c);
          std::endl<char,std::char_traits<char>>((ostream *)poVar7);
          Print::~Print(&local_1d8);
        }
        std::ifstream::close();
      }
      else {
        poVar7 = &local_1d8.ss;
        if (verbose != 0) {
          poVar4 = OutStream();
          AllPrint::AllPrint((AllPrint *)&local_1d8,poVar4);
          std::operator<<((ostream *)poVar7,"**** Error:  could not open file:  ");
          std::operator<<((ostream *)poVar7,(string *)&FullName);
          std::endl<char,std::char_traits<char>>((ostream *)poVar7);
          Print::~Print(&local_1d8);
        }
      }
      std::ifstream::~ifstream(&ifs);
      std::__cxx11::string::~string((string *)&FullName);
      lVar9 = lVar9 + 0x28;
      lVar8 = local_550 + 1;
    }
    if (local_55c != 0) {
      if (verbose != 0) {
        poVar4 = OutStream();
        AllPrint::AllPrint((AllPrint *)&ifs,poVar4);
        std::operator<<(local_4f8,"Total Bad Fabs = ");
        std::ostream::operator<<(local_4f8,local_55c);
        std::endl<char,std::char_traits<char>>(local_4f8);
        Print::~Print((Print *)&ifs);
      }
      bVar6 = false;
      goto LAB_004ffa68;
    }
    bVar6 = true;
    if (verbose == 0) goto LAB_004ffa68;
    poVar4 = OutStream();
    AllPrint::AllPrint((AllPrint *)&ifs,poVar4);
    std::operator<<(local_4f8,"No Bad Fabs.");
    std::endl<char,std::char_traits<char>>(local_4f8);
  }
  else {
    bVar6 = true;
    if (verbose == 0) goto LAB_004ffa68;
    poVar4 = OutStream();
    Print::Print((Print *)&ifs,poVar4);
    std::operator<<(local_4f8,"**** VisMF::Check currently only supports Version_v1.");
    std::endl<char,std::char_traits<char>>(local_4f8);
  }
  bVar6 = true;
  Print::~Print((Print *)&ifs);
LAB_004ffa68:
  std::__cxx11::string::~string((string *)&FullHdrFileName);
  Header::~Header(&hdr);
  return bVar6;
}

Assistant:

bool
VisMF::Check (const std::string& mf_name)
{
//  BL_PROFILE("VisMF::Check()");

  int isOk(true);  // ---- int to broadcast
  int v1(true);

  if(ParallelDescriptor::IOProcessor()) {
   if (verbose) {
       amrex::Print() << "---------------- VisMF::Check:  about to check:  " << mf_name << std::endl;
   }

    char c;
    int nBadFabs(0);
    VisMF::Header hdr;
    std::string FullHdrFileName(mf_name);
    FullHdrFileName += TheMultiFabHdrFileSuffix;

    {
        std::ifstream ifs(FullHdrFileName.c_str());
        ifs >> hdr;
        ifs.close();
    }

    if (verbose) {
        amrex::Print() << "hdr.version =  " << hdr.m_vers << "\n"
                       << "hdr.boxarray size =  " << hdr.m_ba.size() << "\n"
                       << "mf.ncomp =  " << hdr.m_ncomp << "\n"
                       << "number of fabs on disk =  " << hdr.m_fod.size() << "\n"
                       << "DirName = " << DirName(mf_name) << "\n"
                       << "mf_name = " << mf_name << "\n"
                       << "FullHdrFileName = " << FullHdrFileName << "\n";
    }

    if(hdr.m_vers != VisMF::Header::Version_v1) {
     v1 = false;
     if (verbose) {
         amrex::Print() << "**** VisMF::Check currently only supports Version_v1." << std::endl;
     }
    } else {

    // check that the string FAB is where it should be
    for(int i(0); i < hdr.m_fod.size(); ++i) {
      bool badFab(false);
      FabOnDisk &fod = hdr.m_fod[i];
      std::string FullName(VisMF::DirName(mf_name));
      FullName += fod.m_name;
      std::ifstream ifs;
      ifs.open(FullName.c_str(), std::ios::in|std::ios::binary);

      if( ! ifs.good()) {
          if (verbose) {
              amrex::AllPrint() << "**** Error:  could not open file:  " << FullName << std::endl;
          }
          continue;
      }

      ifs.seekg(fod.m_head, std::ios::beg);

      ifs >> c;
      if(c != 'F') {
        badFab = true;
      }
      ifs >> c;
      if(c != 'A') {
        badFab = true;
      }
      ifs >> c;
      if(c != 'B') {
        badFab = true;
      }
      if(badFab) {
        ++nBadFabs;
        if (verbose) {
            amrex::AllPrint() << "**** Error in file:  " << FullName << "  Bad Fab at index = "
                              << i << "  seekpos = " << fod.m_head << "  box = " << hdr.m_ba[i]
                              << std::endl;
        }
      }
      ifs.close();

    }
    if(nBadFabs) {
        if (verbose) {
            amrex::AllPrint() << "Total Bad Fabs = " << nBadFabs << std::endl;
        }
        isOk = false;
    } else {
        if (verbose) {
            amrex::AllPrint() << "No Bad Fabs." << std::endl;
        }
        isOk = true;
    }
    }

  }
  ParallelDescriptor::Bcast(&isOk, 1, ParallelDescriptor::IOProcessorNumber());
  ParallelDescriptor::Bcast(&v1,  1, ParallelDescriptor::IOProcessorNumber());

  return isOk;

}